

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiTiledPartThreading.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1bc0bf::WritingTask::WritingTask
          (WritingTask *this,TaskGroup *group,TiledOutputPart *part,int lx,int ly,int startY,
          int numXTiles)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  TaskGroup *in_RSI;
  Task *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  
  IlmThread_3_4::Task::Task(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__WritingTask_0025ea70;
  *(undefined8 *)(in_RDI + 0x10) = in_RDX;
  *(undefined4 *)(in_RDI + 0x18) = in_ECX;
  *(undefined4 *)(in_RDI + 0x1c) = in_R8D;
  *(undefined4 *)(in_RDI + 0x20) = in_R9D;
  *(undefined4 *)(in_RDI + 0x24) = in_stack_00000008;
  return;
}

Assistant:

WritingTask (
        TaskGroup*       group,
        TiledOutputPart& part,
        int              lx,
        int              ly,
        int              startY,
        int              numXTiles)
        : Task (group)
        , part (part)
        , lx (lx)
        , ly (ly)
        , startY (startY)
        , numXTiles (numXTiles)
    {}